

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_object.cpp
# Opt level: O3

value * __thiscall
mjs::regexp_object::exec(value *__return_storage_ptr__,regexp_object *this,string *str)

{
  regexp_flag rVar1;
  uint uVar2;
  gc_heap *h;
  string *psVar3;
  uint *puVar4;
  void *pvVar5;
  gc_string *pgVar6;
  long *plVar7;
  uint32_t index;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  value *pvVar11;
  wstring_view str_00;
  wstring_view pattern;
  vector<mjs::regexp_match,_std::allocator<mjs::regexp_match>_> match;
  object_ptr res;
  undefined1 local_100 [48];
  value *local_d0;
  wstring local_c8;
  vector<mjs::regexp_match,_std::allocator<mjs::regexp_match>_> local_a8;
  gc_heap_ptr_untyped local_90;
  gc_heap_ptr_untyped local_80;
  void *local_70;
  string *local_68;
  string_view local_60;
  wstring_view local_50;
  wstring_view local_40;
  
  rVar1 = this->flags_;
  uVar8 = 0;
  if ((rVar1 & global) != none) {
    value_representation::get_value
              ((value *)local_100,&this->last_index_,(this->super_native_object).super_object.heap_)
    ;
    local_d0 = (value *)to_integer((value *)local_100);
    value::destroy((value *)local_100);
    uVar8 = (uint)(double)local_d0;
  }
  local_100._0_4_ = number;
  local_100._8_8_ = (gc_heap *)0x0;
  value_representation::value_representation((value_representation *)&local_c8,(value *)local_100);
  (this->last_index_).repr_ = (uint64_t)local_c8._M_dataplus._M_p;
  value::destroy((value *)local_100);
  if (((int)uVar8 < 0) ||
     (puVar4 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)str), *puVar4 < uVar8)) {
    value::value(__return_storage_ptr__,(value *)value::null);
    return __return_storage_ptr__;
  }
  local_d0 = __return_storage_ptr__;
  pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)str);
  local_68 = str;
  puVar4 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)str);
  uVar2 = *puVar4;
  local_70 = pvVar5;
  pgVar6 = gc_heap_ptr_untracked<mjs::gc_string,_true>::dereference
                     (&this->source_,(this->super_native_object).super_object.heap_);
  pattern._M_len = (ulong)pgVar6->length_;
  pattern._M_str = (wchar_t *)(pgVar6 + 1);
  regexp::regexp((regexp *)local_100,pattern,this->flags_);
  str_00._M_str = (wchar_t *)((long)pvVar5 + (ulong)uVar8 * 4 + 4);
  str_00._M_len = (ulong)uVar2 - (ulong)uVar8;
  regexp::exec(&local_a8,(regexp *)local_100,str_00);
  regexp::~regexp((regexp *)local_100);
  psVar3 = local_68;
  pvVar11 = local_d0;
  if (local_a8.super__Vector_base<mjs::regexp_match,_std::allocator<mjs::regexp_match>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_a8.super__Vector_base<mjs::regexp_match,_std::allocator<mjs::regexp_match>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    value::value(local_d0,(value *)value::null);
  }
  else {
    lVar9 = (long)local_70 + 4;
    if ((rVar1 & global) != none) {
      value_representation::value_representation
                ((value_representation *)local_100,
                 (double)((long)(local_a8.
                                 super__Vector_base<mjs::regexp_match,_std::allocator<mjs::regexp_match>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->second - lVar9 >> 2));
      (this->last_index_).repr_ = CONCAT44(local_100._4_4_,local_100._0_4_);
    }
    gc_heap::unsafe_create_from_position<mjs::global_object>
              ((gc_heap *)local_100,(uint32_t)(this->super_native_object).super_object.heap_);
    make_array((gc_heap_ptr<mjs::global_object> *)&local_90,(uint32_t)local_100);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_100);
    plVar7 = (long *)gc_heap_ptr_untyped::get(&local_90);
    local_60._M_len = 5;
    local_60._M_str = "input";
    string::string((string *)&local_c8,(this->super_native_object).super_object.heap_,&local_60);
    local_100._0_4_ = string;
    local_100._8_8_ = (psVar3->super_gc_heap_ptr<mjs::gc_string>).super_gc_heap_ptr_untyped.heap_;
    local_100._16_4_ = (psVar3->super_gc_heap_ptr<mjs::gc_string>).super_gc_heap_ptr_untyped.pos_;
    if ((gc_heap *)local_100._8_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_100._8_8_,(gc_heap_ptr_untyped *)(local_100 + 8));
    }
    (**(code **)(*plVar7 + 8))(plVar7,&local_c8,local_100,0);
    value::destroy((value *)local_100);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_c8);
    plVar7 = (long *)gc_heap_ptr_untyped::get(&local_90);
    local_60._M_len = 5;
    local_60._M_str = "index";
    string::string((string *)&local_c8,(this->super_native_object).super_object.heap_,&local_60);
    local_100._8_8_ =
         (undefined8)
         ((long)(local_a8.super__Vector_base<mjs::regexp_match,_std::allocator<mjs::regexp_match>_>.
                 _M_impl.super__Vector_impl_data._M_start)->first - lVar9 >> 2);
    local_100._0_4_ = number;
    (**(code **)(*plVar7 + 8))(plVar7,&local_c8,local_100,0);
    value::destroy((value *)local_100);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_c8);
    if ((int)((ulong)((long)local_a8.
                            super__Vector_base<mjs::regexp_match,_std::allocator<mjs::regexp_match>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_a8.
                           super__Vector_base<mjs::regexp_match,_std::allocator<mjs::regexp_match>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 4) != 0) {
      lVar9 = 8;
      uVar10 = 0;
      do {
        plVar7 = (long *)gc_heap_ptr_untyped::get(&local_90);
        h = (this->super_native_object).super_object.heap_;
        index_string_abi_cxx11_(&local_c8,(mjs *)(uVar10 & 0xffffffff),index);
        local_40._M_len = local_c8._M_string_length;
        local_40._M_str = local_c8._M_dataplus._M_p;
        string::string((string *)&local_60,h,&local_40);
        local_50._M_str =
             *(wchar_t **)
              ((long)local_a8.
                     super__Vector_base<mjs::regexp_match,_std::allocator<mjs::regexp_match>_>.
                     _M_impl.super__Vector_impl_data._M_start + lVar9 + -8);
        local_50._M_len =
             *(long *)((long)&(local_a8.
                               super__Vector_base<mjs::regexp_match,_std::allocator<mjs::regexp_match>_>
                               ._M_impl.super__Vector_impl_data._M_start)->first + lVar9) -
             (long)local_50._M_str >> 2;
        string::string((string *)&local_80,(this->super_native_object).super_object.heap_,&local_50)
        ;
        pvVar11 = local_d0;
        local_100._0_4_ = string;
        local_100._8_8_ = local_80.heap_;
        local_100._16_4_ = local_80.pos_;
        if (local_80.heap_ != (gc_heap *)0x0) {
          gc_heap::attach(local_80.heap_,(gc_heap_ptr_untyped *)(local_100 + 8));
        }
        (**(code **)(*plVar7 + 8))(plVar7,&local_60,(value *)local_100,0);
        value::destroy((value *)local_100);
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_80);
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity * 4 + 4);
        }
        uVar10 = uVar10 + 1;
        lVar9 = lVar9 + 0x10;
      } while (uVar10 < ((ulong)((long)local_a8.
                                       super__Vector_base<mjs::regexp_match,_std::allocator<mjs::regexp_match>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_a8.
                                      super__Vector_base<mjs::regexp_match,_std::allocator<mjs::regexp_match>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 4 & 0xffffffff))
      ;
    }
    pvVar11->type_ = object;
    (pvVar11->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
         local_90.heap_;
    *(uint32_t *)((long)&pvVar11->field_1 + 8) = local_90.pos_;
    if (local_90.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_90.heap_,(gc_heap_ptr_untyped *)&(pvVar11->field_1).s_);
    }
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_90);
  }
  if (local_a8.super__Vector_base<mjs::regexp_match,_std::allocator<mjs::regexp_match>_>._M_impl.
      super__Vector_impl_data._M_start == (pointer)0x0) {
    return pvVar11;
  }
  operator_delete(local_a8.super__Vector_base<mjs::regexp_match,_std::allocator<mjs::regexp_match>_>
                  ._M_impl.super__Vector_impl_data._M_start,
                  (long)local_a8.
                        super__Vector_base<mjs::regexp_match,_std::allocator<mjs::regexp_match>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)local_a8.
                        super__Vector_base<mjs::regexp_match,_std::allocator<mjs::regexp_match>_>.
                        _M_impl.super__Vector_impl_data._M_start);
  return pvVar11;
}

Assistant:

value exec(const string& str) {
        const bool global = (flags_ & regexp_flag::global) != regexp_flag::none;

        const int32_t start_index = global ? static_cast<int32_t>(to_integer(last_index_.get_value(heap()))) : 0;
        last_index_ = value_representation{value{0.0}};
        if (start_index < 0 || static_cast<size_t>(start_index) > str.view().length()) {
            return value::null;
        }

        const wchar_t* const str_beg = str.view().data();
        const wchar_t* const str_end = str_beg + str.view().length();
        const wchar_t* const search_start = str_beg + start_index;

        const auto match = regexp{source_.dereference(heap()).view(), flags_}.exec(std::wstring_view{search_start, static_cast<size_t>(str_end - search_start)});
        if (match.empty()) {
            return value::null;
        }

        if (global) {
            last_index_ = value_representation{static_cast<double>(match[0].second - str_beg)};
        }

        auto res = make_array(global_.track(heap()), 0);

        res->put(string{heap(), "input"}, value{str});
        res->put(string{heap(), "index"}, value{static_cast<double>(match[0].first - str_beg)});

        for (uint32_t i = 0; i < static_cast<uint32_t>(match.size()); ++i) {
            res->put(string{heap(), index_string(i)}, value{string{heap(), match[i].str()}});
        }

        return value{res};
    }